

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BeginDisabledOverrideReenable(void)

{
  ImGuiContext *g;
  ImGuiContext *v;
  
  v = GImGui;
  (GImGui->Style).Alpha = GImGui->DisabledAlphaBackup;
  v->CurrentItemFlags = v->CurrentItemFlags & 0xfffffbff;
  ImVector<int>::push_back((ImVector<int> *)g,(int *)v);
  v->DisabledStackSize = v->DisabledStackSize + 1;
  return;
}

Assistant:

void ImGui::BeginDisabledOverrideReenable()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.CurrentItemFlags & ImGuiItemFlags_Disabled);
    g.Style.Alpha = g.DisabledAlphaBackup;
    g.CurrentItemFlags &= ~ImGuiItemFlags_Disabled;
    g.ItemFlagsStack.push_back(g.CurrentItemFlags);
    g.DisabledStackSize++;
}